

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O2

void __thiscall higan::Acceptor::OnNewConnectionInternal(Acceptor *this)

{
  int fd;
  undefined1 local_40 [8];
  InetAddress address;
  
  InetAddress::InetAddress((InetAddress *)local_40);
  fd = Socket::Accept(&this->listening_socket_,(InetAddress *)local_40);
  if ((this->newconnection_callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
    Socket::CloseFd(fd);
  }
  else {
    std::function<void_(int,_const_higan::InetAddress_&)>::operator()
              (&this->newconnection_callback_,fd,(InetAddress *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Acceptor::OnNewConnectionInternal()
{
	InetAddress address{};
	int client_fd = listening_socket_.Accept(&address);

	if (newconnection_callback_)
	{
		newconnection_callback_(client_fd, address);
	}
	else
	{
		Socket::CloseFd(client_fd);
	}
}